

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O0

time_duration __thiscall libtorrent::dht::rpc_manager::tick(rpc_manager *this)

{
  pointer *this_00;
  ushort uVar1;
  dht_logger *pdVar2;
  bool bVar3;
  uint uVar4;
  uint32_t uVar5;
  pointer ppVar6;
  element_type *peVar7;
  traversal_algorithm *ptVar8;
  undefined8 uVar9;
  duration<long,_std::ratio<1L,_1000000000L>_> *pdVar10;
  endpoint *ep;
  endpoint *ep_00;
  int local_21c;
  duration<long,_std::ratio<1L,_1000L>_> local_218;
  duration<long,_std::ratio<1L,_1000000000L>_> local_210;
  _Bind<void_(libtorrent::dht::observer::*(std::_Placeholder<1>))()> local_208;
  code *local_1f0;
  undefined8 local_1e8;
  type local_1e0;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  local_1c8;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  local_1c0;
  _Bind<void_(libtorrent::dht::observer::*(std::_Placeholder<1>))()> local_1b8;
  offset_in_observer_to_subr local_1a0 [2];
  type local_190;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  local_178;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  local_170;
  duration<long,_std::ratio<1L,_1000000000L>_> local_168;
  duration<long,_std::ratio<1L,_1000000000L>_> local_160;
  endpoint local_154;
  string local_138;
  _Node_iterator_base<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false>
  local_118;
  _Node_iterator_base<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false>
  local_110;
  endpoint local_104;
  string local_e8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c8;
  duration<long,_std::ratio<1L,_1000000000L>_> local_c0;
  time_duration diff;
  bitfield_flag local_99;
  undefined1 local_98 [8];
  observer_ptr o;
  _Node_iterator_base<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false>
  local_80;
  iterator i;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  time_point now;
  time_duration ret;
  vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
  short_timeouts;
  vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
  timeouts;
  seconds timeout;
  seconds short_timeout;
  rpc_manager *this_local;
  
  timeout.__r = 1;
  timeouts.
  super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xf;
  bVar3 = ::std::
          unordered_multimap<unsigned_short,_std::shared_ptr<libtorrent::dht::observer>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>_>
          ::empty(&this->m_transactions);
  if (bVar3) {
    ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&this_local,&timeout);
  }
  else {
    ::std::
    vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
    ::vector((vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
              *)&short_timeouts.
                 super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::
    vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
    ::vector((vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
              *)&ret);
    now.__d.__r = (duration)1000000000;
    local_68.__d.__r = (duration)libtorrent::aux::time_now();
    local_80._M_cur =
         (__node_type *)
         ::std::
         unordered_multimap<unsigned_short,_std::shared_ptr<libtorrent::dht::observer>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>_>
         ::begin(&this->m_transactions);
    while( true ) {
      o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ::std::
             unordered_multimap<unsigned_short,_std::shared_ptr<libtorrent::dht::observer>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>_>
             ::end(&this->m_transactions);
      bVar3 = ::std::__detail::operator!=
                        (&local_80,
                         (_Node_iterator_base<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false>
                          *)&o.
                             super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
      if (!bVar3) break;
      ppVar6 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
                             *)&local_80);
      ::std::shared_ptr<libtorrent::dht::observer>::shared_ptr
                ((shared_ptr<libtorrent::dht::observer> *)local_98,&ppVar6->second);
      peVar7 = ::std::
               __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_98);
      local_99 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                            )(peVar7->flags).m_val,
                            (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                            )0x80);
      bVar3 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_99);
      if (bVar3) {
        local_80._M_cur =
             (__node_type *)
             ::std::
             unordered_multimap<unsigned_short,_std::shared_ptr<libtorrent::dht::observer>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>_>
             ::erase(&this->m_transactions,local_80._M_cur);
        diff.__r._4_4_ = 5;
      }
      else {
        peVar7 = ::std::
                 __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_98);
        local_c8.__d.__r = (duration)observer::sent(peVar7);
        local_c0.__r = (rep)::std::chrono::operator-(&local_68,&local_c8);
        bVar3 = ::std::chrono::operator>=
                          (&local_c0,
                           (duration<long,_std::ratio<1L,_1L>_> *)
                           &timeouts.
                            super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (bVar3) {
          uVar4 = (**this->m_log->_vptr_dht_logger)(this->m_log,3);
          if ((uVar4 & 1) != 0) {
            pdVar2 = this->m_log;
            peVar7 = ::std::
                     __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_98);
            ptVar8 = observer::algorithm(peVar7);
            uVar5 = traversal_algorithm::id(ptVar8);
            ppVar6 = ::std::__detail::
                     _Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
                     ::operator->((_Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
                                   *)&local_80);
            uVar1 = ppVar6->first;
            peVar7 = ::std::
                     __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_98);
            observer::target_ep(&local_104,peVar7);
            libtorrent::aux::print_endpoint_abi_cxx11_(&local_e8,(aux *)&local_104,ep);
            uVar9 = ::std::__cxx11::string::c_str();
            (*pdVar2->_vptr_dht_logger[1])
                      (pdVar2,3,"[%u] timing out transaction id: %d from: %s",(ulong)uVar5,
                       (ulong)uVar1,uVar9);
            ::std::__cxx11::string::~string((string *)&local_e8);
          }
          local_118._M_cur = local_80._M_cur;
          local_110._M_cur =
               (__node_type *)
               ::std::
               unordered_multimap<unsigned_short,_std::shared_ptr<libtorrent::dht::observer>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>_>_>
               ::erase(&this->m_transactions,local_80._M_cur);
          local_80._M_cur = local_110._M_cur;
          ::std::
          vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
          ::push_back((vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                       *)&short_timeouts.
                          super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_98)
          ;
          diff.__r._4_4_ = 5;
        }
        else {
          bVar3 = ::std::chrono::operator>=(&local_c0,&timeout);
          if (bVar3) {
            peVar7 = ::std::
                     __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_98);
            bVar3 = observer::has_short_timeout(peVar7);
            if (!bVar3) {
              uVar4 = (**this->m_log->_vptr_dht_logger)(this->m_log,3);
              if ((uVar4 & 1) != 0) {
                pdVar2 = this->m_log;
                peVar7 = ::std::
                         __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_98);
                ptVar8 = observer::algorithm(peVar7);
                uVar5 = traversal_algorithm::id(ptVar8);
                ppVar6 = ::std::__detail::
                         _Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
                         ::operator->((_Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
                                       *)&local_80);
                uVar1 = ppVar6->first;
                peVar7 = ::std::
                         __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_98);
                observer::target_ep(&local_154,peVar7);
                libtorrent::aux::print_endpoint_abi_cxx11_(&local_138,(aux *)&local_154,ep_00);
                uVar9 = ::std::__cxx11::string::c_str();
                (*pdVar2->_vptr_dht_logger[1])
                          (pdVar2,3,"[%u] short-timing out transaction id: %d from: %s",(ulong)uVar5
                           ,(ulong)uVar1,uVar9);
                ::std::__cxx11::string::~string((string *)&local_138);
              }
              ::std::__detail::
              _Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
              ::operator++((_Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
                            *)&local_80);
              ::std::
              vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
              ::push_back((vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                           *)&ret,(value_type *)local_98);
              diff.__r._4_4_ = 5;
              goto LAB_00844be1;
            }
          }
          local_168.__r =
               (rep)::std::chrono::operator-
                              ((duration<long,_std::ratio<1L,_1L>_> *)
                               &timeouts.
                                super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_c0);
          local_160.__r =
               (rep)::std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                              (&local_168);
          pdVar10 = ::std::min<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                              (&local_160,&now.__d);
          now.__d.__r = (duration)pdVar10->__r;
          ::std::__detail::
          _Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
          ::operator++((_Node_iterator<std::pair<const_unsigned_short,_std::shared_ptr<libtorrent::dht::observer>_>,_false,_false>
                        *)&local_80);
          diff.__r._4_4_ = 0;
        }
      }
LAB_00844be1:
      ::std::shared_ptr<libtorrent::dht::observer>::~shared_ptr
                ((shared_ptr<libtorrent::dht::observer> *)local_98);
    }
    this_00 = &short_timeouts.
               super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_170._M_current =
         (shared_ptr<libtorrent::dht::observer> *)
         ::std::
         vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
         ::begin((vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                  *)this_00);
    local_178._M_current =
         (shared_ptr<libtorrent::dht::observer> *)
         ::std::
         vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
         ::end((vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                *)this_00);
    local_1a0[1] = 0;
    local_1a0[0] = 0x19;
    ::std::bind<void(libtorrent::dht::observer::*)(),std::_Placeholder<1>const&>
              (&local_190,local_1a0,(_Placeholder<1> *)&::std::placeholders::_1);
    ::std::
    for_each<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::dht::observer>*,std::vector<std::shared_ptr<libtorrent::dht::observer>,std::allocator<std::shared_ptr<libtorrent::dht::observer>>>>,std::_Bind<void(libtorrent::dht::observer::*(std::_Placeholder<1>))()>>
              (&local_1b8,local_170,local_178,&local_190);
    local_1c0._M_current =
         (shared_ptr<libtorrent::dht::observer> *)
         ::std::
         vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
         ::begin((vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                  *)&ret);
    local_1c8._M_current =
         (shared_ptr<libtorrent::dht::observer> *)
         ::std::
         vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
         ::end((vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                *)&ret);
    local_1f0 = observer::short_timeout;
    local_1e8 = 0;
    ::std::bind<void(libtorrent::dht::observer::*)(),std::_Placeholder<1>const&>
              (&local_1e0,(offset_in_observer_to_subr *)&local_1f0,
               (_Placeholder<1> *)&::std::placeholders::_1);
    ::std::
    for_each<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::dht::observer>*,std::vector<std::shared_ptr<libtorrent::dht::observer>,std::allocator<std::shared_ptr<libtorrent::dht::observer>>>>,std::_Bind<void(libtorrent::dht::observer::*(std::_Placeholder<1>))()>>
              (&local_208,local_1c0,local_1c8,&local_1e0);
    local_21c = 200;
    ::std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_218,&local_21c);
    local_210.__r =
         (rep)::std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                        (&local_218);
    pdVar10 = ::std::max<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                        (&now.__d,&local_210);
    this_local = (rpc_manager *)pdVar10->__r;
    diff.__r._4_4_ = 1;
    ::std::
    vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
    ::~vector((vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
               *)&ret);
    ::std::
    vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
    ::~vector((vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
               *)&short_timeouts.
                  super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return (time_duration)(rep)this_local;
}

Assistant:

time_duration rpc_manager::tick()
{
	INVARIANT_CHECK;

	constexpr auto short_timeout = seconds(1);
	constexpr auto timeout = seconds(15);

	// look for observers that have timed out

	if (m_transactions.empty()) return short_timeout;

	std::vector<observer_ptr> timeouts;
	std::vector<observer_ptr> short_timeouts;

	time_duration ret = short_timeout;
	time_point now = aux::time_now();

	for (auto i = m_transactions.begin(); i != m_transactions.end();)
	{
		observer_ptr o = i->second;

		if (o->flags & observer::flag_done)
		{
			// remove cancelled requests
			i = m_transactions.erase(i);
			continue;
		}

		time_duration diff = now - o->sent();
		if (diff >= timeout)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (m_log->should_log(dht_logger::rpc_manager))
			{
				m_log->log(dht_logger::rpc_manager, "[%u] timing out transaction id: %d from: %s"
					, o->algorithm()->id(), i->first
					, aux::print_endpoint(o->target_ep()).c_str());
			}
#endif
			i = m_transactions.erase(i);
			timeouts.push_back(o);
			continue;
		}

		// don't call short_timeout() again if we've
		// already called it once
		if (diff >= short_timeout && !o->has_short_timeout())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (m_log->should_log(dht_logger::rpc_manager))
			{
				m_log->log(dht_logger::rpc_manager, "[%u] short-timing out transaction id: %d from: %s"
					, o->algorithm()->id(), i->first
					, aux::print_endpoint(o->target_ep()).c_str());
			}
#endif
			++i;

			short_timeouts.push_back(o);
			continue;
		}

		ret = std::min(duration_cast<time_duration>(timeout - diff), ret);
		++i;
	}

	std::for_each(timeouts.begin(), timeouts.end(), std::bind(&observer::timeout, _1));
	std::for_each(short_timeouts.begin(), short_timeouts.end(), std::bind(&observer::short_timeout, _1));

	return std::max(ret, duration_cast<time_duration>(milliseconds(200)));
}